

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

double __thiscall
helics::RandomDropFilterOperation::getProperty(RandomDropFilterOperation *this,string_view property)

{
  int iVar1;
  size_type __rlen;
  double dVar2;
  
  if (property._M_len == 4) {
    iVar1 = bcmp(property._M_str,"prob",4);
  }
  else {
    if (property._M_len != 8) {
      return -1e+49;
    }
    iVar1 = bcmp(property._M_str,"dropprob",8);
  }
  dVar2 = -1e+49;
  if (iVar1 == 0) {
    dVar2 = (this->dropProb).super___atomic_float<double>._M_fp;
  }
  return dVar2;
}

Assistant:

double RandomDropFilterOperation::getProperty(std::string_view property)
{
    if ((property == "dropprob") || (property == "prob")) {
        return dropProb.load();
    }
    return FilterOperations::getProperty(property);
}